

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O3

void __thiscall cmXMLWriter::CData(cmXMLWriter *this,string *data)

{
  ostream *poVar1;
  
  CloseStartElement(this);
  this->IsContent = true;
  poVar1 = this->Output;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<![CDATA[",9);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(data->_M_dataplus)._M_p,data->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]]>",3);
  return;
}

Assistant:

void cmXMLWriter::CData(std::string const& data)
{
  this->PreContent();
  this->Output << "<![CDATA[" << data << "]]>";
}